

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_run_completed(uv_udp_t *handle)

{
  long *plVar1;
  int iVar2;
  size_t sVar3;
  QUEUE *q;
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  if ((handle->flags & 0x1000000) != 0) {
    __assert_fail("!(handle->flags & UV_HANDLE_UDP_PROCESSING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/udp.c"
                  ,0x83,"void uv__udp_run_completed(uv_udp_t *)");
  }
  handle->flags = handle->flags | 0x1000000;
  while( true ) {
    if (handle->write_completed_queue == (void **)handle->write_completed_queue[0]) {
      if (handle->write_queue == (void **)handle->write_queue[0]) {
        uv__io_stop(handle->loop,&handle->io_watcher,4);
        iVar2 = uv__io_active(&handle->io_watcher,1);
        if (((iVar2 == 0) && ((handle->flags & 4) != 0)) &&
           (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
          handle->loop->active_handles = handle->loop->active_handles - 1;
        }
      }
      handle->flags = handle->flags & 0xfeffffff;
      return;
    }
    plVar1 = (long *)handle->write_completed_queue[0];
    *(long *)plVar1[1] = *plVar1;
    *(long *)(*plVar1 + 8) = plVar1[1];
    if ((handle->loop->active_reqs).count == 0) break;
    (handle->loop->active_reqs).count = (handle->loop->active_reqs).count - 1;
    sVar3 = uv__count_bufs((uv_buf_t *)plVar1[0x13],*(uint *)(plVar1 + 0x12));
    handle->send_queue_size = handle->send_queue_size - sVar3;
    handle->send_queue_count = handle->send_queue_count - 1;
    if ((long *)plVar1[0x13] != plVar1 + 0x16) {
      uv__free((void *)plVar1[0x13]);
    }
    plVar1[0x13] = 0;
    if (plVar1[0x15] != 0) {
      if (plVar1[0x14] < 0) {
        (*(code *)plVar1[0x15])(plVar1 + -10,plVar1[0x14] & 0xffffffff);
      }
      else {
        (*(code *)plVar1[0x15])(plVar1 + -10,0);
      }
    }
  }
  __assert_fail("uv__has_active_reqs(handle->loop)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/src/unix/udp.c"
                ,0x8b,"void uv__udp_run_completed(uv_udp_t *)");
}

Assistant:

static void uv__udp_run_completed(uv_udp_t* handle) {
  uv_udp_send_t* req;
  QUEUE* q;

  assert(!(handle->flags & UV_HANDLE_UDP_PROCESSING));
  handle->flags |= UV_HANDLE_UDP_PROCESSING;

  while (!QUEUE_EMPTY(&handle->write_completed_queue)) {
    q = QUEUE_HEAD(&handle->write_completed_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    uv__req_unregister(handle->loop, req);

    handle->send_queue_size -= uv__count_bufs(req->bufs, req->nbufs);
    handle->send_queue_count--;

    if (req->bufs != req->bufsml)
      uv__free(req->bufs);
    req->bufs = NULL;

    if (req->send_cb == NULL)
      continue;

    /* req->status >= 0 == bytes written
     * req->status <  0 == errno
     */
    if (req->status >= 0)
      req->send_cb(req, 0);
    else
      req->send_cb(req, req->status);
  }

  if (QUEUE_EMPTY(&handle->write_queue)) {
    /* Pending queue and completion queue empty, stop watcher. */
    uv__io_stop(handle->loop, &handle->io_watcher, POLLOUT);
    if (!uv__io_active(&handle->io_watcher, POLLIN))
      uv__handle_stop(handle);
  }

  handle->flags &= ~UV_HANDLE_UDP_PROCESSING;
}